

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

BatchResult * __thiscall ProjectOperator::next(ProjectOperator *this)

{
  DbVector *pDVar1;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  mapped_type *ppDVar3;
  unique_ptr<BatchResult,_std::default_delete<BatchResult>_> br;
  DbVector *vec;
  
  br._M_t.super___uniq_ptr_impl<BatchResult,_std::default_delete<BatchResult>_>._M_t.
  super__Tuple_impl<0UL,_BatchResult_*,_std::default_delete<BatchResult>_>.
  super__Head_base<0UL,_BatchResult_*,_false>._M_head_impl._0_4_ =
       (*this->next_->_vptr_BaseOperator[4])();
  br._M_t.super___uniq_ptr_impl<BatchResult,_std::default_delete<BatchResult>_>._M_t.
  super__Tuple_impl<0UL,_BatchResult_*,_std::default_delete<BatchResult>_>.
  super__Head_base<0UL,_BatchResult_*,_false>._M_head_impl._4_4_ = extraout_var;
  if ((tuple<BatchResult_*,_std::default_delete<BatchResult>_>)
      br._M_t.super___uniq_ptr_impl<BatchResult,_std::default_delete<BatchResult>_>._M_t.
      super__Tuple_impl<0UL,_BatchResult_*,_std::default_delete<BatchResult>_>.
      super__Head_base<0UL,_BatchResult_*,_false>._M_head_impl ==
      (_Head_base<0UL,_BatchResult_*,_false>)0x0) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
               *)0x0;
  }
  else {
    vec = (DbVector *)0x0;
    evaluateExpr_(this,&vec,this->expr_,
                  (BatchResult *)
                  br._M_t.super___uniq_ptr_impl<BatchResult,_std::default_delete<BatchResult>_>._M_t
                  .super__Tuple_impl<0UL,_BatchResult_*,_std::default_delete<BatchResult>_>.
                  super__Head_base<0UL,_BatchResult_*,_false>._M_head_impl);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
               *)operator_new(0x30);
    pDVar1 = vec;
    p_Var2 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(this_00->_M_t)._M_impl = 0;
    *(undefined8 *)&(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppDVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
              ::operator[](this_00,&this->col_name_);
    *ppDVar3 = pDVar1;
  }
  std::unique_ptr<BatchResult,_std::default_delete<BatchResult>_>::~unique_ptr(&br);
  return (BatchResult *)this_00;
}

Assistant:

BatchResult* next() {
        std::unique_ptr<BatchResult> br(next_->next());
        if (br == nullptr)
            return nullptr;

        DbVector* vec = nullptr;
        evaluateExpr_(&vec, expr_, br.get());

        BatchResult* rs = new BatchResult();
        rs->add(col_name_, vec);
        return rs;
    }